

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O0

void __thiscall ThreadedReplayer::~ThreadedReplayer(ThreadedReplayer *this)

{
  ThreadedReplayer *this_local;
  
  ~ThreadedReplayer(this);
  operator_delete(this,0xe18);
  return;
}

Assistant:

~ThreadedReplayer()
	{
		tear_down_threads();
		flush_pipeline_cache();
		flush_validation_cache();

		for (auto &sampler : samplers)
			if (sampler.second)
				vkDestroySampler(device->get_device(), sampler.second, nullptr);
		for (auto &layout : layouts)
			if (layout.second)
				vkDestroyDescriptorSetLayout(device->get_device(), layout.second, nullptr);
		for (auto &pipeline_layout : pipeline_layouts)
			if (pipeline_layout.second)
				vkDestroyPipelineLayout(device->get_device(), pipeline_layout.second, nullptr);
		for (auto &render_pass : render_passes)
			if (render_pass.second)
				vkDestroyRenderPass(device->get_device(), render_pass.second, nullptr);

		free_pipelines();

		shader_modules.delete_cache([this](Hash, VkShaderModule module) {
			if (module != VK_NULL_HANDLE)
				vkDestroyShaderModule(device->get_device(), module, nullptr);
		});
	}